

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Imputer::MergeFrom(Imputer *this,Imputer *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  Int64Vector *pIVar3;
  DoubleVector *pDVar4;
  StringToDoubleMap *pSVar5;
  Int64ToDoubleMap *pIVar6;
  Int64Vector *from_00;
  DoubleVector *from_01;
  StringToDoubleMap *from_02;
  Int64ToDoubleMap *from_03;
  ReplaceValueUnion RVar7;
  ImputedValueUnion IVar8;
  LogFinisher local_59;
  ImputedValueUnion local_58;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/Imputer.pb.cc"
               ,0x266);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = from->_oneof_case_[0];
  switch(uVar1) {
  case 1:
    if (uVar1 == 1) {
      IVar8 = from->ImputedValue_;
    }
    else {
      IVar8.imputeddoublevalue_ = 0.0;
    }
    if (this->_oneof_case_[0] != 1) {
      local_58 = IVar8;
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 1;
      IVar8 = local_58;
    }
    (this->ImputedValue_).imputeddoublevalue_ = (double)IVar8;
    break;
  case 2:
    if (uVar1 == 2) {
      IVar8 = from->ImputedValue_;
    }
    else {
      IVar8.imputeddoublevalue_ = 0.0;
    }
    if (this->_oneof_case_[0] != 2) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 2;
    }
    this->ImputedValue_ = IVar8;
    break;
  case 3:
    if (uVar1 == 3) {
      pDVar4 = (from->ImputedValue_).imputeddoublearray_;
    }
    else {
      pDVar4 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 3) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 3;
      (this->ImputedValue_).imputeddoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if ((this->ImputedValue_).imputeddoublearray_ ==
        (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->ImputedValue_).imputedstringvalue_,(string *)pDVar4);
    }
    else {
      std::__cxx11::string::_M_assign((string *)(this->ImputedValue_).imputeddoublearray_);
    }
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 4;
      pDVar4 = (DoubleVector *)operator_new(0x28);
      DoubleVector::DoubleVector(pDVar4);
      (this->ImputedValue_).imputeddoublearray_ = pDVar4;
    }
    pDVar4 = (this->ImputedValue_).imputeddoublearray_;
    if (from->_oneof_case_[0] == 4) {
      from_01 = (from->ImputedValue_).imputeddoublearray_;
    }
    else {
      from_01 = DoubleVector::default_instance();
    }
    DoubleVector::MergeFrom(pDVar4,from_01);
    break;
  case 5:
    if (this->_oneof_case_[0] != 5) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 5;
      pIVar3 = (Int64Vector *)operator_new(0x28);
      Int64Vector::Int64Vector(pIVar3);
      (this->ImputedValue_).imputedint64array_ = pIVar3;
    }
    pIVar3 = (this->ImputedValue_).imputedint64array_;
    if (from->_oneof_case_[0] == 5) {
      from_00 = (from->ImputedValue_).imputedint64array_;
    }
    else {
      from_00 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(pIVar3,from_00);
    break;
  case 6:
    if (this->_oneof_case_[0] != 6) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 6;
      pSVar5 = (StringToDoubleMap *)operator_new(0x38);
      StringToDoubleMap::StringToDoubleMap(pSVar5);
      (this->ImputedValue_).imputedstringdictionary_ = pSVar5;
    }
    pSVar5 = (this->ImputedValue_).imputedstringdictionary_;
    if (from->_oneof_case_[0] == 6) {
      from_02 = (from->ImputedValue_).imputedstringdictionary_;
    }
    else {
      from_02 = StringToDoubleMap::default_instance();
    }
    StringToDoubleMap::MergeFrom(pSVar5,from_02);
    break;
  case 7:
    if (this->_oneof_case_[0] != 7) {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 7;
      pIVar6 = (Int64ToDoubleMap *)operator_new(0x38);
      Int64ToDoubleMap::Int64ToDoubleMap(pIVar6);
      (this->ImputedValue_).imputedint64dictionary_ = pIVar6;
    }
    pIVar6 = (this->ImputedValue_).imputedint64dictionary_;
    if (from->_oneof_case_[0] == 7) {
      from_03 = (from->ImputedValue_).imputedint64dictionary_;
    }
    else {
      from_03 = Int64ToDoubleMap::default_instance();
    }
    Int64ToDoubleMap::MergeFrom(pIVar6,from_03);
  }
  uVar1 = from->_oneof_case_[1];
  if (uVar1 == 0xd) {
    if (uVar1 == 0xd) {
      RVar7 = from->ReplaceValue_;
    }
    else {
      RVar7.replacedoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[1] != 0xd) {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xd;
      (this->ReplaceValue_).replacedoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if ((string *)(this->ReplaceValue_).replaceint64value_ ==
        (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&(this->ReplaceValue_).replacestringvalue_,(string *)RVar7);
    }
    else {
      std::__cxx11::string::_M_assign((string *)(this->ReplaceValue_).replaceint64value_);
    }
  }
  else if (uVar1 == 0xc) {
    if (uVar1 == 0xc) {
      RVar7 = from->ReplaceValue_;
    }
    else {
      RVar7.replacedoublevalue_ = 0.0;
    }
    if (this->_oneof_case_[1] != 0xc) {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xc;
    }
    this->ReplaceValue_ = RVar7;
  }
  else if (uVar1 == 0xb) {
    if (uVar1 == 0xb) {
      local_58 = *(ImputedValueUnion *)&from->ReplaceValue_;
    }
    else {
      local_58 = (ImputedValueUnion)0x0;
    }
    if (this->_oneof_case_[1] != 0xb) {
      clear_ReplaceValue(this);
      this->_oneof_case_[1] = 0xb;
    }
    (this->ReplaceValue_).replacedoublevalue_ = (double)local_58;
  }
  return;
}

Assistant:

void Imputer::MergeFrom(const Imputer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Imputer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.ImputedValue_case()) {
    case kImputedDoubleValue: {
      set_imputeddoublevalue(from.imputeddoublevalue());
      break;
    }
    case kImputedInt64Value: {
      set_imputedint64value(from.imputedint64value());
      break;
    }
    case kImputedStringValue: {
      set_imputedstringvalue(from.imputedstringvalue());
      break;
    }
    case kImputedDoubleArray: {
      mutable_imputeddoublearray()->::CoreML::Specification::DoubleVector::MergeFrom(from.imputeddoublearray());
      break;
    }
    case kImputedInt64Array: {
      mutable_imputedint64array()->::CoreML::Specification::Int64Vector::MergeFrom(from.imputedint64array());
      break;
    }
    case kImputedStringDictionary: {
      mutable_imputedstringdictionary()->::CoreML::Specification::StringToDoubleMap::MergeFrom(from.imputedstringdictionary());
      break;
    }
    case kImputedInt64Dictionary: {
      mutable_imputedint64dictionary()->::CoreML::Specification::Int64ToDoubleMap::MergeFrom(from.imputedint64dictionary());
      break;
    }
    case IMPUTEDVALUE_NOT_SET: {
      break;
    }
  }
  switch (from.ReplaceValue_case()) {
    case kReplaceDoubleValue: {
      set_replacedoublevalue(from.replacedoublevalue());
      break;
    }
    case kReplaceInt64Value: {
      set_replaceint64value(from.replaceint64value());
      break;
    }
    case kReplaceStringValue: {
      set_replacestringvalue(from.replacestringvalue());
      break;
    }
    case REPLACEVALUE_NOT_SET: {
      break;
    }
  }
}